

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

bool __thiscall cmQtAutoGenInitializer::InitAutogenTarget(cmQtAutoGenInitializer *this)

{
  pointer *this_00;
  unsigned_long uVar1;
  bool bVar2;
  cmMakefile *this_01;
  cmLocalGenerator *this_02;
  ulong uVar3;
  string *psVar4;
  long lVar5;
  set<cmTarget_*,_std::less<cmTarget_*>,_std::allocator<cmTarget_*>_> *psVar6;
  reference ppcVar7;
  char *pcVar8;
  char *pcVar9;
  reference config_00;
  cmLinkImplementationLibraries *this_03;
  mapped_type_conflict1 *pmVar10;
  size_type sVar11;
  cmTarget *pcVar12;
  cmGeneratorTarget *this_04;
  set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_05;
  reference u;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_06;
  pair<std::_Rb_tree_const_iterator<cmTarget_*>,_bool> pVar13;
  allocator<char> local_441;
  string local_440;
  cmTarget *local_420;
  cmTarget *depTarget_1;
  iterator __end2_1;
  iterator __begin2_1;
  set<cmTarget_*,_std::less<cmTarget_*>,_std::allocator<cmTarget_*>_> *__range2_1;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *depName;
  iterator __end3_2;
  iterator __begin3_2;
  set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range3_2;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3d8;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3c8;
  cmTarget *local_3b0;
  cmTarget *autogenTarget;
  undefined1 local_3a0;
  reference local_398;
  pair<const_cmGeneratorTarget_*const,_unsigned_long> *item_1;
  iterator __end3_1;
  iterator __begin3_1;
  map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
  *__range3_1;
  cmGeneratorTarget *libTarget;
  cmLinkItem *item;
  const_iterator __end5;
  const_iterator __begin5;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *__range5;
  cmLinkImplementationLibraries *libs;
  string *config;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
  commonTargets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b0;
  undefined1 local_298 [8];
  cmCustomCommand cc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_deps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_output;
  cmTarget *depTarget;
  iterator __end2;
  iterator __begin2;
  set<cmTarget_*,_std::less<cmTarget_*>,_std::allocator<cmTarget_*>_> *__range2;
  byte local_132;
  allocator<char> local_131;
  undefined1 local_130 [6];
  bool usePRE_BUILD;
  allocator<char> local_109;
  value_type local_108;
  allocator<char> local_e1;
  value_type local_e0;
  undefined1 local_c0 [8];
  cmCustomCommandLine currentLine;
  cmCustomCommandLines commandLines;
  string tools;
  string autogenComment;
  undefined1 local_40 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  autogenProvides;
  cmGlobalGenerator *globalGen;
  cmLocalGenerator *localGen;
  cmMakefile *makefile;
  cmQtAutoGenInitializer *this_local;
  
  this_01 = cmTarget::GetMakefile(this->Target->Target);
  this_02 = cmGeneratorTarget::GetLocalGenerator(this->Target);
  autogenProvides.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)cmLocalGenerator::GetGlobalGenerator(this_02);
  cmMakefile::AddCMakeOutputFile(this_01,&(this->AutogenTarget).InfoFile);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_40);
  if (((this->Moc).super_GenVarsT.Enabled & 1U) != 0) {
    AddGeneratedSource(this,&(this->Moc).MocsCompilation,&(this->Moc).super_GenVarsT,true);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_40,&(this->Moc).MocsCompilation);
  }
  std::__cxx11::string::string((string *)(tools.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)
             &commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
              super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if (((this->Moc).super_GenVarsT.Enabled & 1U) != 0) {
    std::__cxx11::string::operator+=
              ((string *)
               &commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                .super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,"MOC");
  }
  if (((this->Uic).super_GenVarsT.Enabled & 1U) != 0) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::__cxx11::string::operator+=
                ((string *)
                 &commandLines.
                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage," and ");
    }
    std::__cxx11::string::operator+=
              ((string *)
               &commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                .super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,"UIC");
  }
  std::__cxx11::string::operator=((string *)(tools.field_2._M_local_buf + 8),"Automatic ");
  std::__cxx11::string::operator+=
            ((string *)(tools.field_2._M_local_buf + 8),
             (string *)
             &commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
              super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::operator+=((string *)(tools.field_2._M_local_buf + 8)," for target ");
  psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
  std::__cxx11::string::operator+=((string *)(tools.field_2._M_local_buf + 8),(string *)psVar4);
  std::__cxx11::string::~string
            ((string *)
             &commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
              super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cmCustomCommandLines::cmCustomCommandLines
            ((cmCustomCommandLines *)
             &currentLine.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmCustomCommandLine::cmCustomCommandLine((cmCustomCommandLine *)local_c0);
  psVar4 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_c0,psVar4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"-E",&local_e1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_c0,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"cmake_autogen",&local_109);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_c0,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_c0,&(this->AutogenTarget).InfoFile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_130,"$<CONFIGURATION>",&local_131);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_c0,(value_type *)local_130);
  std::__cxx11::string::~string((string *)local_130);
  std::allocator<char>::~allocator(&local_131);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
            ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
             &currentLine.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_c0);
  cmCustomCommandLine::~cmCustomCommandLine((cmCustomCommandLine *)local_c0);
  local_132 = 0;
  (**(code **)(*(long *)autogenProvides.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x18))(&__range2);
  lVar5 = std::__cxx11::string::find((char *)&__range2,0x7c80ce);
  std::__cxx11::string::~string((string *)&__range2);
  if (lVar5 != -1) {
    local_132 = 1;
  }
  if ((local_132 & 1) != 0) {
    bVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&(this->AutogenTarget).DependFiles);
    if (!bVar2) {
      local_132 = 0;
    }
    if (((this->AutogenTarget).GlobalTarget & 1U) != 0) {
      local_132 = 0;
    }
  }
  if ((local_132 & 1) == 0) {
    if (((this->AutogenTarget).DependOrigin & 1U) != 0) {
      std::
      map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
      ::map((map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
             *)&__range3);
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this->ConfigsList);
      config = (string *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&this->ConfigsList);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&config), bVar2) {
        config_00 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end3);
        this_03 = cmGeneratorTarget::GetLinkImplementationLibraries(this->Target,config_00);
        if (this_03 != (cmLinkImplementationLibraries *)0x0) {
          __end5 = std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::begin
                             (&this_03->Libraries);
          item = (cmLinkItem *)
                 std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::end
                           (&this_03->Libraries);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end5,(__normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                                             *)&item), bVar2) {
            libTarget = (cmGeneratorTarget *)
                        __gnu_cxx::
                        __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                        ::operator*(&__end5);
            __range3_1 = *(map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                           **)&libTarget->ObjectDirectory;
            if (((cmGeneratorTarget *)__range3_1 != (cmGeneratorTarget *)0x0) &&
               (bVar2 = StaticLibraryCycle(this->Target,(cmGeneratorTarget *)__range3_1,config_00),
               !bVar2)) {
              pmVar10 = std::
                        map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                        ::operator[]((map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                                      *)&__range3,(key_type *)&__range3_1);
              *pmVar10 = *pmVar10 + 1;
            }
            __gnu_cxx::
            __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
            ::operator++(&__end5);
          }
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
      __end3_1 = std::
                 map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                 ::begin((map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                          *)&__range3);
      item_1 = (pair<const_cmGeneratorTarget_*const,_unsigned_long> *)
               std::
               map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
               ::end((map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                      *)&__range3);
      while (bVar2 = std::operator!=(&__end3_1,(_Self *)&item_1), bVar2) {
        local_398 = std::
                    _Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>::
                    operator*(&__end3_1);
        uVar1 = local_398->second;
        sVar11 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size(&this->ConfigsList);
        if (uVar1 == sVar11) {
          pVar13 = std::set<cmTarget_*,_std::less<cmTarget_*>,_std::allocator<cmTarget_*>_>::insert
                             (&(this->AutogenTarget).DependTargets,&local_398->first->Target);
          autogenTarget = (cmTarget *)pVar13.first._M_node;
          local_3a0 = pVar13.second;
        }
        std::_Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>::
        operator++(&__end3_1);
      }
      std::
      map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
      ::~map((map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
              *)&__range3);
    }
    pcVar8 = (char *)std::__cxx11::string::c_str();
    this_06 = &(this->AutogenTarget).DependFiles;
    local_3d0._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(this_06);
    local_3d8._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(this_06);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&__range3_2 + 7));
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    vector<std::_Rb_tree_const_iterator<std::__cxx11::string>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_3c8,
               local_3d0,local_3d8,
               (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)((long)&__range3_2 + 7));
    pcVar9 = (char *)std::__cxx11::string::c_str();
    pcVar12 = cmMakefile::AddUtilityCommand
                        (this_01,&(this->AutogenTarget).Name,Generator,true,pcVar8,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_40,&local_3c8,
                         (cmCustomCommandLines *)
                         &currentLine.
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,false,pcVar9,false,
                         false);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_3c8);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&__range3_2 + 7));
    local_3b0 = pcVar12;
    this_04 = (cmGeneratorTarget *)operator_new(0x5a8);
    cmGeneratorTarget::cmGeneratorTarget(this_04,local_3b0,this_02);
    cmLocalGenerator::AddGeneratorTarget(this_02,this_04);
    if (((this->AutogenTarget).DependOrigin & 1U) != 0) {
      this_05 = cmGeneratorTarget::GetUtilities_abi_cxx11_(this->Target);
      __end3_2 = std::
                 set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::begin(this_05);
      depName = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)std::
                   set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::end(this_05);
      while (bVar2 = std::operator!=(&__end3_2,(_Self *)&depName), bVar2) {
        u = std::
            _Rb_tree_const_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator*(&__end3_2);
        cmTarget::AddUtility(local_3b0,&u->Value,this_01);
        std::
        _Rb_tree_const_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator++(&__end3_2);
      }
    }
    psVar6 = &(this->AutogenTarget).DependTargets;
    __end2_1 = std::set<cmTarget_*,_std::less<cmTarget_*>,_std::allocator<cmTarget_*>_>::begin
                         (psVar6);
    depTarget_1 = (cmTarget *)
                  std::set<cmTarget_*,_std::less<cmTarget_*>,_std::allocator<cmTarget_*>_>::end
                            (psVar6);
    while (bVar2 = std::operator!=(&__end2_1,(_Self *)&depTarget_1), bVar2) {
      ppcVar7 = std::_Rb_tree_const_iterator<cmTarget_*>::operator*(&__end2_1);
      pcVar12 = local_3b0;
      local_420 = *ppcVar7;
      psVar4 = cmTarget::GetName_abi_cxx11_(local_420);
      cmTarget::AddUtility(pcVar12,psVar4,this_01);
      std::_Rb_tree_const_iterator<cmTarget_*>::operator++(&__end2_1);
    }
    uVar3 = std::__cxx11::string::empty();
    pcVar12 = local_3b0;
    if ((uVar3 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,"FOLDER",&local_441);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      cmTarget::SetProperty(pcVar12,&local_440,pcVar8);
      std::__cxx11::string::~string((string *)&local_440);
      std::allocator<char>::~allocator(&local_441);
    }
    cmTarget::AddUtility(this->Target->Target,&(this->AutogenTarget).Name,this_01);
    if (((this->AutogenTarget).GlobalTarget & 1U) != 0) {
      cmQtAutoGenGlobalInitializer::AddToGlobalAutoGen
                (this->GlobalInitializer,this_02,&(this->AutogenTarget).Name);
    }
  }
  else {
    psVar6 = &(this->AutogenTarget).DependTargets;
    __end2 = std::set<cmTarget_*,_std::less<cmTarget_*>,_std::allocator<cmTarget_*>_>::begin(psVar6)
    ;
    depTarget = (cmTarget *)
                std::set<cmTarget_*,_std::less<cmTarget_*>,_std::allocator<cmTarget_*>_>::end
                          (psVar6);
    while (bVar2 = std::operator!=(&__end2,(_Self *)&depTarget), bVar2) {
      ppcVar7 = std::_Rb_tree_const_iterator<cmTarget_*>::operator*(&__end2);
      pcVar12 = this->Target->Target;
      psVar4 = cmTarget::GetName_abi_cxx11_(*ppcVar7);
      cmTarget::AddUtility(pcVar12,psVar4,this_01);
      std::_Rb_tree_const_iterator<cmTarget_*>::operator++(&__end2);
    }
    this_00 = &no_deps.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&cc.HaveComment);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_2b0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_2c8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_40);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_2e0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&cc.HaveComment);
    cmCustomCommandLines::cmCustomCommandLines
              ((cmCustomCommandLines *)
               &commonTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (cmCustomCommandLines *)
               &currentLine.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    pcVar9 = (char *)std::__cxx11::string::c_str();
    cmCustomCommand::cmCustomCommand
              ((cmCustomCommand *)local_298,this_01,&local_2b0,&local_2c8,&local_2e0,
               (cmCustomCommandLines *)
               &commonTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,pcVar8,pcVar9);
    cmCustomCommandLines::~cmCustomCommandLines
              ((cmCustomCommandLines *)
               &commonTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2e0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2b0);
    cmCustomCommand::SetEscapeOldStyle((cmCustomCommand *)local_298,false);
    cmCustomCommand::SetEscapeAllowMakeVars((cmCustomCommand *)local_298,true);
    cmTarget::AddPreBuildCommand(this->Target->Target,(cmCustomCommand *)local_298);
    cmCustomCommand::~cmCustomCommand((cmCustomCommand *)local_298);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&cc.HaveComment);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&no_deps.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  cmCustomCommandLines::~cmCustomCommandLines
            ((cmCustomCommandLines *)
             &currentLine.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)(tools.field_2._M_local_buf + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_40);
  return true;
}

Assistant:

bool cmQtAutoGenInitializer::InitAutogenTarget()
{
  cmMakefile* makefile = this->Target->Target->GetMakefile();
  cmLocalGenerator* localGen = this->Target->GetLocalGenerator();
  cmGlobalGenerator* globalGen = localGen->GetGlobalGenerator();

  // Register info file as generated by CMake
  makefile->AddCMakeOutputFile(this->AutogenTarget.InfoFile);

  // Files provided by the autogen target
  std::vector<std::string> autogenProvides;
  if (this->Moc.Enabled) {
    this->AddGeneratedSource(this->Moc.MocsCompilation, this->Moc, true);
    autogenProvides.push_back(this->Moc.MocsCompilation);
  }

  // Compose target comment
  std::string autogenComment;
  {
    std::string tools;
    if (this->Moc.Enabled) {
      tools += "MOC";
    }
    if (this->Uic.Enabled) {
      if (!tools.empty()) {
        tools += " and ";
      }
      tools += "UIC";
    }
    autogenComment = "Automatic ";
    autogenComment += tools;
    autogenComment += " for target ";
    autogenComment += this->Target->GetName();
  }

  // Compose command lines
  cmCustomCommandLines commandLines;
  {
    cmCustomCommandLine currentLine;
    currentLine.push_back(cmSystemTools::GetCMakeCommand());
    currentLine.push_back("-E");
    currentLine.push_back("cmake_autogen");
    currentLine.push_back(this->AutogenTarget.InfoFile);
    currentLine.push_back("$<CONFIGURATION>");
    commandLines.push_back(std::move(currentLine));
  }

  // Use PRE_BUILD on demand
  bool usePRE_BUILD = false;
  if (globalGen->GetName().find("Visual Studio") != std::string::npos) {
    // Under VS use a PRE_BUILD event instead of a separate target to
    // reduce the number of targets loaded into the IDE.
    // This also works around a VS 11 bug that may skip updating the target:
    //  https://connect.microsoft.com/VisualStudio/feedback/details/769495
    usePRE_BUILD = true;
  }
  // Disable PRE_BUILD in some cases
  if (usePRE_BUILD) {
    // Cannot use PRE_BUILD with file depends
    if (!this->AutogenTarget.DependFiles.empty()) {
      usePRE_BUILD = false;
    }
    // Cannot use PRE_BUILD when a global autogen target is in place
    if (AutogenTarget.GlobalTarget) {
      usePRE_BUILD = false;
    }
  }
  // Create the autogen target/command
  if (usePRE_BUILD) {
    // Add additional autogen target dependencies to origin target
    for (cmTarget* depTarget : this->AutogenTarget.DependTargets) {
      this->Target->Target->AddUtility(depTarget->GetName(), makefile);
    }

    // Add the pre-build command directly to bypass the OBJECT_LIBRARY
    // rejection in cmMakefile::AddCustomCommandToTarget because we know
    // PRE_BUILD will work for an OBJECT_LIBRARY in this specific case.
    //
    // PRE_BUILD does not support file dependencies!
    const std::vector<std::string> no_output;
    const std::vector<std::string> no_deps;
    cmCustomCommand cc(makefile, no_output, autogenProvides, no_deps,
                       commandLines, autogenComment.c_str(),
                       this->Dir.Work.c_str());
    cc.SetEscapeOldStyle(false);
    cc.SetEscapeAllowMakeVars(true);
    this->Target->Target->AddPreBuildCommand(cc);
  } else {

    // Add link library target dependencies to the autogen target
    // dependencies
    if (this->AutogenTarget.DependOrigin) {
      // add_dependencies/addUtility do not support generator expressions.
      // We depend only on the libraries found in all configs therefore.
      std::map<cmGeneratorTarget const*, std::size_t> commonTargets;
      for (std::string const& config : this->ConfigsList) {
        cmLinkImplementationLibraries const* libs =
          this->Target->GetLinkImplementationLibraries(config);
        if (libs != nullptr) {
          for (cmLinkItem const& item : libs->Libraries) {
            cmGeneratorTarget const* libTarget = item.Target;
            if ((libTarget != nullptr) &&
                !StaticLibraryCycle(this->Target, libTarget, config)) {
              // Increment target config count
              commonTargets[libTarget]++;
            }
          }
        }
      }
      for (auto const& item : commonTargets) {
        if (item.second == this->ConfigsList.size()) {
          this->AutogenTarget.DependTargets.insert(item.first->Target);
        }
      }
    }

    // Create autogen target
    cmTarget* autogenTarget = makefile->AddUtilityCommand(
      this->AutogenTarget.Name, cmMakefile::TargetOrigin::Generator, true,
      this->Dir.Work.c_str(), /*byproducts=*/autogenProvides,
      std::vector<std::string>(this->AutogenTarget.DependFiles.begin(),
                               this->AutogenTarget.DependFiles.end()),
      commandLines, false, autogenComment.c_str());
    // Create autogen generator target
    localGen->AddGeneratorTarget(
      new cmGeneratorTarget(autogenTarget, localGen));

    // Forward origin utilities to autogen target
    if (this->AutogenTarget.DependOrigin) {
      for (BT<std::string> const& depName : this->Target->GetUtilities()) {
        autogenTarget->AddUtility(depName.Value, makefile);
      }
    }
    // Add additional autogen target dependencies to autogen target
    for (cmTarget* depTarget : this->AutogenTarget.DependTargets) {
      autogenTarget->AddUtility(depTarget->GetName(), makefile);
    }

    // Set FOLDER property in autogen target
    if (!this->TargetsFolder.empty()) {
      autogenTarget->SetProperty("FOLDER", this->TargetsFolder.c_str());
    }

    // Add autogen target to the origin target dependencies
    this->Target->Target->AddUtility(this->AutogenTarget.Name, makefile);

    // Add autogen target to the global autogen target dependencies
    if (this->AutogenTarget.GlobalTarget) {
      this->GlobalInitializer->AddToGlobalAutoGen(localGen,
                                                  this->AutogenTarget.Name);
    }
  }

  return true;
}